

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O2

uint ts_subtree_get_changed_ranges
               (Subtree *old_tree,Subtree *new_tree,TreeCursor *cursor1,TreeCursor *cursor2,
               TSLanguage *language,TSRangeArray *included_range_differences,TSRange **ranges)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  IteratorComparison IVar6;
  _Bool _Var5;
  uint32_t start_byte;
  ulong uVar8;
  long lVar9;
  Iterator *self;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  Length LVar15;
  Length LVar16;
  Length LVar17;
  Length start;
  Length end;
  TSRangeArray results;
  Iterator new_iter;
  Iterator old_iter;
  uint32_t local_d4;
  uint32_t local_cc;
  ulong local_c8;
  TSRangeArray local_b8;
  Subtree *local_a8;
  Subtree *local_a0;
  TreeCursor *local_98;
  TreeCursor *local_90;
  ulong local_88;
  Iterator local_80;
  Iterator local_58;
  ulong uVar7;
  
  local_b8.contents = (TSRange *)0x0;
  local_b8.size = 0;
  local_b8.capacity = 0;
  local_a8 = old_tree;
  local_98 = cursor1;
  iterator_new(&local_58,cursor1,old_tree,language);
  local_a0 = new_tree;
  local_90 = cursor2;
  iterator_new(&local_80,cursor2,new_tree,language);
  LVar15 = iterator_start_position(&local_58);
  uVar8 = LVar15._0_8_;
  LVar16 = iterator_start_position(&local_80);
  uVar7 = LVar16._0_8_;
  uVar14 = uVar7 & 0xffffffff;
  if (LVar15.bytes < LVar16.bytes) {
    ts_range_array_add(&local_b8,LVar15,LVar16);
    LVar15 = LVar16;
    LVar17 = LVar16;
  }
  else {
    LVar17.extent.column = LVar15.extent.column;
    LVar17.bytes = (int)uVar7;
    LVar17.extent.row = (int)(uVar7 >> 0x20);
    if (LVar16.bytes < LVar15.bytes) {
      ts_range_array_add(&local_b8,LVar16,LVar15);
      uVar14 = uVar8 & 0xffffffff;
      LVar17 = LVar15;
    }
    else {
      LVar15.extent.column = LVar16.extent.column;
      LVar15.bytes = (int)uVar8;
      LVar15.extent.row = (int)(uVar8 >> 0x20);
    }
  }
  local_cc = LVar17.extent.column;
  local_c8 = LVar17._0_8_ >> 0x20;
  uVar12 = 0;
  do {
    local_d4 = LVar15.extent.column;
    uVar8 = LVar15._0_8_;
    IVar6 = iterator_compare(&local_58,&local_80);
    if (IVar6 == IteratorDiffers) {
      LVar15 = iterator_end_position(&local_58);
      LVar16 = iterator_end_position(&local_80);
      if (LVar15.bytes < LVar16.bytes) {
        LVar16 = LVar15;
      }
      local_c8 = LVar16._0_8_ >> 0x20;
      bVar3 = true;
    }
    else {
      start_byte = LVar15.bytes;
      if (IVar6 == IteratorMatches) {
        LVar16 = iterator_end_position(&local_58);
        _Var4 = ts_range_array_intersects(included_range_differences,uVar12,start_byte,LVar16.bytes)
        ;
        if (_Var4) {
          local_c8 = uVar8 >> 0x20;
          local_d4 = local_cc;
          uVar14 = uVar8 & 0xffffffff;
          goto LAB_0011155e;
        }
LAB_001115d2:
        local_c8 = LVar16._0_8_ >> 0x20;
      }
      else {
LAB_0011155e:
        LVar16.extent.column = local_d4;
        LVar16.bytes = (int)uVar14;
        LVar16.extent.row = (int)(uVar14 >> 0x20);
        _Var4 = iterator_descend(&local_58,start_byte);
        _Var5 = iterator_descend(&local_80,start_byte);
        if (!_Var4) {
          self = &local_80;
          if (_Var5) goto LAB_0011158b;
          LVar15 = iterator_end_position(&local_58);
          LVar16 = iterator_end_position(&local_80);
          if (LVar15.bytes < LVar16.bytes) {
            LVar16 = LVar15;
          }
          goto LAB_001115d2;
        }
        self = &local_58;
        if (!_Var5) {
LAB_0011158b:
          LVar16 = iterator_end_position(self);
          local_c8 = LVar16._0_8_ >> 0x20;
          bVar3 = true;
          goto LAB_001115f0;
        }
      }
      bVar3 = false;
    }
LAB_001115f0:
    while( true ) {
      local_d4 = LVar16.extent.column;
      uVar14 = LVar16._0_8_;
      uVar13 = LVar16.bytes;
      if ((local_58.cursor.stack.size == 0) ||
         (LVar15 = iterator_end_position(&local_58), uVar13 < LVar15.bytes)) break;
      iterator_advance(&local_58);
    }
    while ((uVar10 = local_80.visible_depth, local_80.cursor.stack.size != 0 &&
           (LVar15 = iterator_end_position(&local_80), uVar10 = local_80.visible_depth,
           LVar15.bytes <= uVar13))) {
      iterator_advance(&local_80);
    }
    while (local_88 = uVar8, uVar2 = local_58.visible_depth, uVar10 < local_58.visible_depth) {
      iterator_ascend(&local_58);
      uVar8 = local_88;
    }
    while (uVar2 < uVar10) {
      iterator_ascend(&local_80);
      uVar10 = local_80.visible_depth;
    }
    uVar8 = uVar14 & 0xffffffff | local_c8 << 0x20;
    LVar15.extent.column = local_d4;
    LVar15.bytes = (int)uVar8;
    LVar15.extent.row = (int)(uVar8 >> 0x20);
    if (bVar3) {
      start.extent.column = local_cc;
      start.bytes = (undefined4)local_88;
      start.extent.row = local_88._4_4_;
      end.extent.column = local_d4;
      end.bytes = (int)uVar8;
      end.extent.row = (int)(uVar8 >> 0x20);
      ts_range_array_add(&local_b8,start,end);
    }
    uVar10 = included_range_differences->size;
    uVar2 = uVar10;
    if (uVar10 < uVar12) {
      uVar2 = uVar12;
    }
    uVar8 = (ulong)uVar12;
    lVar9 = uVar8 * 0x18 + 0x14;
    uVar11 = uVar12 - 1;
    do {
      uVar12 = uVar2;
      if (uVar10 <= uVar8) break;
      uVar8 = uVar8 + 1;
      uVar12 = uVar11 + 1;
      puVar1 = (uint *)((long)&(included_range_differences->contents->start_point).row + lVar9);
      lVar9 = lVar9 + 0x18;
      uVar11 = uVar12;
    } while (*puVar1 <= uVar13);
    if ((local_58.cursor.stack.size == 0) || (local_cc = local_d4, local_80.cursor.stack.size == 0))
    {
      LVar17 = ts_subtree_total_size(*local_a8);
      LVar16 = ts_subtree_total_size(*local_a0);
      uVar12 = LVar16.bytes;
      LVar15 = LVar17;
      if ((LVar17.bytes < uVar12) || (LVar15 = LVar16, LVar16 = LVar17, uVar12 < LVar17.bytes)) {
        ts_range_array_add(&local_b8,LVar15,LVar16);
      }
      (local_98->stack).size = local_58.cursor.stack.size;
      (local_98->stack).capacity = local_58.cursor.stack.capacity;
      local_98->tree = local_58.cursor.tree;
      (local_98->stack).contents = local_58.cursor.stack.contents;
      (local_90->stack).size = local_80.cursor.stack.size;
      (local_90->stack).capacity = local_80.cursor.stack.capacity;
      local_90->tree = local_80.cursor.tree;
      (local_90->stack).contents = local_80.cursor.stack.contents;
      *ranges = local_b8.contents;
      return local_b8.size;
    }
  } while( true );
}

Assistant:

unsigned ts_subtree_get_changed_ranges(const Subtree *old_tree, const Subtree *new_tree,
                                       TreeCursor *cursor1, TreeCursor *cursor2,
                                       const TSLanguage *language,
                                       const TSRangeArray *included_range_differences,
                                       TSRange **ranges) {
  TSRangeArray results = array_new();

  Iterator old_iter = iterator_new(cursor1, old_tree, language);
  Iterator new_iter = iterator_new(cursor2, new_tree, language);

  unsigned included_range_difference_index = 0;

  Length position = iterator_start_position(&old_iter);
  Length next_position = iterator_start_position(&new_iter);
  if (position.bytes < next_position.bytes) {
    ts_range_array_add(&results, position, next_position);
    position = next_position;
  } else if (position.bytes > next_position.bytes) {
    ts_range_array_add(&results, next_position, position);
    next_position = position;
  }

  do {
    #ifdef DEBUG_GET_CHANGED_RANGES
    printf("At [%-2u, %-2u] Compare ", position.extent.row, position.extent.column);
    iterator_print_state(&old_iter);
    printf("\tvs\t");
    iterator_print_state(&new_iter);
    puts("");
    #endif

    bool is_changed = false;
    switch (iterator_compare(&old_iter, &new_iter)) {
      case IteratorMatches:
        next_position = iterator_end_position(&old_iter);
        if (ts_range_array_intersects(
          included_range_differences,
          included_range_difference_index,
          position.bytes, next_position.bytes
        )) {
          next_position = position;
          // fall through
        } else {
          break;
        }

      case IteratorMayDiffer:
        if (iterator_descend(&old_iter, position.bytes)) {
          if (!iterator_descend(&new_iter, position.bytes)) {
            is_changed = true;
            next_position = iterator_end_position(&old_iter);
          }
        } else if (iterator_descend(&new_iter, position.bytes)) {
          is_changed = true;
          next_position = iterator_end_position(&new_iter);
        } else {
          next_position = length_min(
            iterator_end_position(&old_iter),
            iterator_end_position(&new_iter)
          );
        }
        break;

      case IteratorDiffers:
        is_changed = true;
        next_position = length_min(
          iterator_end_position(&old_iter),
          iterator_end_position(&new_iter)
        );
        break;
    }

    while (
      !iterator_done(&old_iter) &&
      iterator_end_position(&old_iter).bytes <= next_position.bytes
    ) iterator_advance(&old_iter);

    while (
      !iterator_done(&new_iter) &&
      iterator_end_position(&new_iter).bytes <= next_position.bytes
    ) iterator_advance(&new_iter);

    while (old_iter.visible_depth > new_iter.visible_depth) iterator_ascend(&old_iter);

    while (new_iter.visible_depth > old_iter.visible_depth) iterator_ascend(&new_iter);

    if (is_changed) {
      #ifdef DEBUG_GET_CHANGED_RANGES
      printf(
        "  change: [[%u, %u] - [%u, %u]]\n",
        position.extent.row, position.extent.column,
        next_position.extent.row, next_position.extent.column
      );
      #endif

      ts_range_array_add(&results, position, next_position);
    }

    position = next_position;

    while (included_range_difference_index < included_range_differences->size) {
      const TSRange *range = &included_range_differences->contents[included_range_difference_index];
      if (range->end_byte <= position.bytes) {
        included_range_difference_index++;
      } else {
        break;
      }
    }
  } while (!iterator_done(&old_iter) && !iterator_done(&new_iter));

  Length old_size = ts_subtree_total_size(*old_tree);
  Length new_size = ts_subtree_total_size(*new_tree);
  if (old_size.bytes < new_size.bytes) {
    ts_range_array_add(&results, old_size, new_size);
  } else if (new_size.bytes < old_size.bytes) {
    ts_range_array_add(&results, new_size, old_size);
  }

  *cursor1 = old_iter.cursor;
  *cursor2 = new_iter.cursor;
  *ranges = results.contents;
  return results.size;
}